

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tester.h
# Opt level: O1

void __thiscall MemVector<int>::MemVector(MemVector<int> *this,size_t size)

{
  allocator_type local_3d;
  value_type_conflict1 local_3c;
  vector<int,_std::allocator<int>_> local_38;
  
  (this->accesses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->accesses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->vec_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->accesses_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vec_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->vec_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,size,(allocator_type *)&local_3c);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->vec_,&local_38);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_3c = 0;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,size,&local_3c,&local_3d);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->accesses_,&local_38);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

MemVector(const size_t size)
    {
        vec_ = std::vector<T>(size);
        accesses_ = std::vector<int>(size, 0);
    }